

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::changeSelector
          (CostAttributes *this,MatrixDynSize *inputSelector)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  MatrixSelector *this_00;
  PointerType pdVar5;
  long lVar6;
  PointerType pdVar7;
  assign_op<double,_double> local_101;
  PointerType local_100;
  PointerType local_f8;
  long local_f0;
  long local_e8;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_e0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_0>
  local_c0;
  
  uVar2 = iDynTree::MatrixDynSize::rows();
  uVar1 = iDynTree::VectorDynSize::size();
  if (uVar2 == uVar1) {
    lVar3 = iDynTree::MatrixDynSize::cols();
    (*((this->selector).
       super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Selector[3])();
    lVar4 = iDynTree::MatrixDynSize::cols();
    if (lVar3 == lVar4) {
      this_00 = (MatrixSelector *)operator_new(0xb8);
      MatrixSelector::MatrixSelector(this_00,inputSelector);
      std::__shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>::
      reset<iDynTree::optimalcontrol::MatrixSelector>
                (&(this->selector).
                  super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>
                 ,this_00);
      (*((this->selector).
         super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_vptr_Selector[3])();
      local_f8 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar3 = iDynTree::MatrixDynSize::rows();
      lVar4 = iDynTree::MatrixDynSize::cols();
      local_100 = (PointerType)iDynTree::MatrixDynSize::data();
      local_e8 = iDynTree::MatrixDynSize::rows();
      local_f0 = iDynTree::MatrixDynSize::cols();
      pdVar5 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar6 = iDynTree::MatrixDynSize::rows();
      local_c0.m_rhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = iDynTree::MatrixDynSize::cols();
      local_c0.m_lhs.m_lhs.m_functor.m_other = 0.5;
      local_c0.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_f8;
      local_c0.m_rhs.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_100;
      local_c0.m_rhs.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = local_e8;
      local_c0.m_rhs.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = local_f0;
      local_c0.m_lhs.m_lhs.m_rows.m_value = lVar4;
      local_c0.m_lhs.m_lhs.m_cols.m_value = lVar3;
      local_c0.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = lVar3;
      local_c0.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = lVar4;
      local_c0.m_rhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pdVar5;
      local_c0.m_rhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = lVar6;
      pdVar5 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar3 = iDynTree::MatrixDynSize::rows();
      local_e0.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = iDynTree::MatrixDynSize::cols();
      local_e0.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pdVar5;
      local_e0.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = lVar3;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>const>,0>,Eigen::internal::assign_op<double,double>>
                (&local_e0,&local_c0,&local_101,(type)0x0);
      local_f8 = (PointerType)iDynTree::MatrixDynSize::data();
      local_100 = (PointerType)iDynTree::MatrixDynSize::rows();
      lVar3 = iDynTree::MatrixDynSize::cols();
      (*((this->selector).
         super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_vptr_Selector[3])();
      pdVar7 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar4 = iDynTree::MatrixDynSize::rows();
      local_c0.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = iDynTree::MatrixDynSize::cols();
      local_c0.m_lhs._0_8_ = local_f8;
      local_c0.m_lhs.m_lhs.m_rows.m_value = (long)local_100;
      local_c0.m_lhs.m_lhs.m_cols.m_value = lVar3;
      local_c0.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pdVar7;
      local_c0.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = lVar4;
      pdVar5 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar3 = iDynTree::MatrixDynSize::rows();
      local_e0.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = iDynTree::MatrixDynSize::cols();
      local_e0.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pdVar5;
      local_e0.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = lVar3;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
                (&local_e0,
                 (Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)&local_c0,&local_101,(type)0x0);
      return true;
    }
  }
  iDynTree::reportError
            ("L2NormCost","getObject","The new selector dimensionsions do not match the old one.");
  return false;
}

Assistant:

bool changeSelector(const MatrixDynSize& inputSelector) {
                if ((inputSelector.rows() != this->selector->size()) || (inputSelector.cols() != this->selector->asSelectorMatrix().cols())) {
                    reportError("L2NormCost", "getObject", "The new selector dimensionsions do not match the old one.");
                    return false;
                }
                this->selector.reset(new MatrixSelector(inputSelector));
                toEigen(this->gradientSubMatrix) = 0.5 * toEigen(this->selector->asSelectorMatrix()).transpose() * (toEigen(this->weightMatrix) + toEigen(this->weightMatrix).transpose());
                toEigen(this->hessianMatrix) = toEigen(this->gradientSubMatrix) * toEigen(this->selector->asSelectorMatrix());

                return true;
            }